

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

uchar __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STInteger<unsigned_char>,unsigned_char>
          (STObject *this,SField *field)

{
  uchar uVar1;
  int iVar2;
  STBase *pSVar3;
  long lVar4;
  
  pSVar3 = peekAtPField(this,field);
  if (pSVar3 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar2 = (*pSVar3->_vptr_STBase[4])(pSVar3);
  if (iVar2 == 0) {
    uVar1 = '\0';
  }
  else {
    lVar4 = __dynamic_cast(pSVar3,&STBase::typeinfo,&STInteger<unsigned_char>::typeinfo,0);
    if (lVar4 == 0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    uVar1 = *(uchar *)(lVar4 + 0x10);
  }
  return uVar1;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }